

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_uuid.c
# Opt level: O2

ssize_t read_all(int fd,char *buf,size_t count)

{
  ssize_t sVar1;
  int *piVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar3 = 0;
  memset(buf,0,count);
  do {
    if (count == 0) {
      return uVar3;
    }
    uVar4 = 0;
    while (sVar1 = read(fd,buf,count), sVar1 < 1) {
      piVar2 = __errno_location();
      if (((*piVar2 != 0xb) && (sVar1 != 0 && *piVar2 != 4)) || (4 < uVar4)) {
        return uVar3 | -(ulong)(uVar3 == 0);
      }
      uVar4 = uVar4 + 1;
    }
    count = count - sVar1;
    buf = buf + sVar1;
    uVar3 = uVar3 + sVar1;
  } while( true );
}

Assistant:

static ssize_t read_all(int fd, char *buf, size_t count)
{
	ssize_t ret;
	ssize_t c = 0;
	int tries = 0;

	memset(buf, 0, count);
	while (count > 0) {
		ret = read(fd, buf, count);
		if (ret <= 0) {
			if ((errno == EAGAIN || errno == EINTR || ret == 0) &&
			    (tries++ < 5))
				continue;
			return c ? c : -1;
		}
		if (ret > 0)
			tries = 0;
		count -= ret;
		buf += ret;
		c += ret;
	}
	return c;
}